

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::LogDisabledTests
          (cmCTestTestHandler *this,
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          *disabledTests)

{
  cmCTest *pcVar1;
  undefined8 this_00;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  reference pcVar5;
  string local_960 [32];
  string local_940;
  undefined1 local_920 [8];
  ostringstream cmCTestLog_msg_3;
  string local_7a8 [36];
  int local_784;
  undefined1 local_780 [8];
  ostringstream cmCTestLog_msg_2;
  cmCTestTestResult *dt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  *__range2;
  string local_5c8;
  undefined1 local_5a8 [8];
  ostringstream cmCTestLog_msg_1;
  char *local_430;
  char *disabled_reason;
  ostringstream local_3f8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_280 [8];
  cmGeneratedFileStream ofs;
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  *disabledTests_local;
  cmCTestTestHandler *this_local;
  
  ofs._608_8_ = disabledTests;
  bVar2 = std::
          vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
          ::empty(disabledTests);
  if (!bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,None);
    std::__cxx11::ostringstream::ostringstream(local_3f8);
    poVar3 = (ostream *)std::ostream::operator<<(local_3f8,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"The following tests did not run:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x27a,pcVar4,false);
    std::__cxx11::string::~string((string *)&disabled_reason);
    std::__cxx11::ostringstream::~ostringstream(local_3f8);
    cmCTestGenericHandler::StartLogFile
              (&this->super_cmCTestGenericHandler,"TestsDisabled",(cmGeneratedFileStream *)local_280
              );
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
    cmCTest::GetColorCode_abi_cxx11_(&local_5c8,(this->super_cmCTestGenericHandler).CTest,BLUE);
    std::operator<<((ostream *)local_5a8,(string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x27f,pcVar4,false);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
    this_00 = ofs._608_8_;
    __end2 = std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::begin((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                      *)ofs._608_8_);
    dt = (cmCTestTestResult *)
         std::
         vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
         ::end((vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                *)this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                                  *)&dt);
      if (!bVar2) break;
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
               ::operator*(&__end2);
      poVar3 = (ostream *)std::ostream::operator<<(local_280,pcVar5->TestCount);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = std::operator<<(poVar3,(string *)pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      bVar2 = std::operator==(&pcVar5->CompletionStatus,"Disabled");
      if (bVar2) {
        local_430 = "Disabled";
      }
      else {
        local_430 = "Skipped";
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
      poVar3 = std::operator<<((ostream *)local_780,"\t");
      local_784 = (int)std::setw(3);
      poVar3 = std::operator<<(poVar3,(_Setw)local_784);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar5->TestCount);
      poVar3 = std::operator<<(poVar3," - ");
      poVar3 = std::operator<<(poVar3,(string *)pcVar5);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::operator<<(poVar3,local_430);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x289,pcVar4,false);
      std::__cxx11::string::~string(local_7a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
      __gnu_cxx::
      __normal_iterator<const_cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_920);
    cmCTest::GetColorCode_abi_cxx11_
              (&local_940,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR);
    std::operator<<((ostream *)local_920,(string *)&local_940);
    std::__cxx11::string::~string((string *)&local_940);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x28c,pcVar4,false);
    std::__cxx11::string::~string(local_960);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_920);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  }
  return;
}

Assistant:

void cmCTestTestHandler::LogDisabledTests(
  const std::vector<cmCTestTestResult>& disabledTests)
{
  if (!disabledTests.empty()) {
    cmGeneratedFileStream ofs;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::endl
                 << "The following tests did not run:" << std::endl);
    this->StartLogFile("TestsDisabled", ofs);

    const char* disabled_reason;
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::BLUE));
    for (cmCTestTestResult const& dt : disabledTests) {
      ofs << dt.TestCount << ":" << dt.Name << std::endl;
      if (dt.CompletionStatus == "Disabled") {
        disabled_reason = "Disabled";
      } else {
        disabled_reason = "Skipped";
      }
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "\t" << std::setw(3) << dt.TestCount << " - " << dt.Name
                      << " (" << disabled_reason << ")" << std::endl);
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR));
  }
}